

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq3dd.cpp
# Opt level: O1

int __thiscall TPZGraphElQ3dd::ExportType(TPZGraphElQ3dd *this,TPZDrawStyle st)

{
  return -(uint)(st != EVTKStyle) | 0xc;
}

Assistant:

int TPZGraphElQ3dd::ExportType(TPZDrawStyle st){
	switch(st)
	{
		case(EVTKStyle):
			return 12;//vtk_hexahedron
			//		break;
		default:
			return -1;
	}
	//	return -1;
}